

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall testing::Matcher<SDL_Window_*>::Matcher(Matcher<SDL_Window_*> *this,Snapshot *value)

{
  ComparisonBase<testing::internal::EqMatcher<SDL_Window_*>,_SDL_Window_*,_testing::internal::AnyEq>
  local_38;
  Matcher<SDL_Window_*> local_30;
  Snapshot *local_18;
  Snapshot *value_local;
  Matcher<SDL_Window_*> *this_local;
  
  local_18 = value;
  value_local = (Snapshot *)this;
  internal::MatcherBase<SDL_Window_*>::MatcherBase(&this->super_MatcherBase<SDL_Window_*>);
  (this->super_MatcherBase<SDL_Window_*>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__Matcher_00506a00;
  local_38.rhs_ = (SDL_Window_conflict *)Eq<SDL_Window*>(local_18);
  Matcher<SDL_Window*>::Matcher<testing::internal::EqMatcher<SDL_Window*>,void>
            ((Matcher<SDL_Window*> *)&local_30,(EqMatcher<SDL_Window_*> *)&local_38);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }